

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace_align4,size_t wkspSize,
                 HUF_CElt *oldHufTable,HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  BYTE *pBVar7;
  uint uVar8;
  int in_stack_ffffffffffffffa0;
  uint local_54;
  HUF_CElt *local_50;
  uint local_44;
  BYTE *local_40;
  void *local_38;
  
  if (wkspSize < 0x1900) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  local_54 = maxSymbolValue;
  if (maxSymbolValue == 0) {
    local_54 = 0xff;
  }
  local_40 = (BYTE *)((long)dst + dstSize);
  uVar8 = 0xb;
  if (huffLog != 0) {
    uVar8 = huffLog;
  }
  if ((repeat != (HUF_repeat *)0x0 && preferRepeat != 0) && (*repeat == HUF_repeat_valid)) {
    sVar2 = HUF_compressCTable_internal
                      ((BYTE *)dst,(BYTE *)dst,local_40,src,srcSize,nbStreams,oldHufTable,
                       in_stack_ffffffffffffffa0);
    return sVar2;
  }
  local_50 = (HUF_CElt *)CONCAT44(local_50._4_4_,uVar8);
  sVar2 = HIST_count_wksp((uint *)workSpace_align4,&local_54,src,srcSize,workSpace_align4,wkspSize);
  if (sVar2 < 0xffffffffffffff89) {
    if (sVar2 == srcSize) {
      *(undefined1 *)dst = *src;
      sVar2 = 1;
      goto LAB_0067c53e;
    }
    bVar1 = (srcSize >> 7) + 4 < sVar2;
    sVar2 = 0;
  }
  else {
LAB_0067c53e:
    bVar1 = false;
  }
  if (!bVar1) {
    return sVar2;
  }
  if (((repeat != (HUF_repeat *)0x0) && (*repeat == HUF_repeat_check)) && (-1 < (int)local_54)) {
    lVar5 = 0;
    bVar1 = false;
    do {
      bVar1 = (bool)(bVar1 | (oldHufTable[lVar5].nbBits == '\0' &&
                             *(int *)((long)workSpace_align4 + lVar5 * 4) != 0));
      lVar5 = lVar5 + 1;
    } while ((ulong)local_54 + 1 != lVar5);
    if (bVar1) {
      *repeat = HUF_repeat_none;
    }
  }
  pBVar7 = (BYTE *)dst;
  if ((repeat != (HUF_repeat *)0x0 && preferRepeat != 0) && (*repeat != HUF_repeat_none))
  goto LAB_0067c7cd;
  local_44 = FSE_optimalTableLog_internal((uint)local_50,srcSize,local_54,1);
  local_50 = (HUF_CElt *)((long)workSpace_align4 + 0x400);
  local_38 = (void *)((long)workSpace_align4 + 0x800);
  sVar3 = HUF_buildCTable_wksp(local_50,(uint *)workSpace_align4,local_54,local_44,local_38,0x1100);
  if (0xffffffffffffff88 < sVar3) {
    return sVar3;
  }
  memset(local_50 + (local_54 + 1),0,(ulong)(local_54 + 1) * -4 + 0x400);
  local_44 = (uint)sVar3;
  sVar3 = HUF_writeCTable_wksp(dst,dstSize,local_50,local_54,local_44,local_38,0x2c0);
  if (sVar3 < 0xffffffffffffff89) {
    if ((repeat != (HUF_repeat *)0x0) && (*repeat != HUF_repeat_none)) {
      if ((int)local_54 < 0) {
        uVar4 = 0;
      }
      else {
        lVar5 = 0;
        uVar4 = 0;
        do {
          uVar4 = uVar4 + (uint)oldHufTable[lVar5].nbBits *
                          *(int *)((long)workSpace_align4 + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while ((ulong)local_54 + 1 != lVar5);
        uVar4 = uVar4 >> 3;
      }
      if ((int)local_54 < 0) {
        uVar6 = 0;
      }
      else {
        lVar5 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + (uint)*(byte *)((long)workSpace_align4 + lVar5 * 4 + 0x402) *
                          *(int *)((long)workSpace_align4 + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while ((ulong)local_54 + 1 != lVar5);
        uVar6 = uVar6 >> 3;
      }
      if (srcSize <= sVar3 + 0xc || uVar4 <= uVar6 + sVar3) {
        sVar3 = HUF_compressCTable_internal
                          ((BYTE *)dst,(BYTE *)dst,local_40,src,srcSize,nbStreams,oldHufTable,
                           in_stack_ffffffffffffffa0);
        goto LAB_0067c6e0;
      }
    }
    if (sVar3 + 0xc < srcSize) {
      if (repeat != (HUF_repeat *)0x0) {
        *repeat = HUF_repeat_none;
      }
      pBVar7 = (BYTE *)(sVar3 + (long)dst);
      bVar1 = true;
      sVar3 = sVar2;
      if (oldHufTable != (HUF_CElt *)0x0) {
        memcpy(oldHufTable,local_50,0x400);
      }
    }
    else {
      bVar1 = false;
      sVar3 = 0;
    }
  }
  else {
LAB_0067c6e0:
    bVar1 = false;
  }
  oldHufTable = local_50;
  if (!bVar1) {
    return sVar3;
  }
LAB_0067c7cd:
  sVar2 = HUF_compressCTable_internal
                    ((BYTE *)dst,pBVar7,local_40,src,srcSize,nbStreams,oldHufTable,
                     in_stack_ffffffffffffffa0);
  return sVar2;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace_align4, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                 const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace_align4;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    HUF_STATIC_ASSERT(sizeof(*table) <= HUF_WORKSPACE_SIZE);
    assert(((size_t)workSpace_align4 & 3) == 0);   /* must be aligned on 4-bytes boundaries */

    /* checks & inits */
    if (wkspSize < HUF_WORKSPACE_SIZE) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, workSpace_align4, wkspSize) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        ZSTD_memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, bmi2);
}